

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O3

void HydroUtils::ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,int ncomp,Geometry *geom,Real mult,
               bool fluxes_are_area_weighted)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  ulong local_160;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  
  dVar39 = (geom->super_CoordSys).inv_dx[0];
  dVar37 = (geom->super_CoordSys).inv_dx[1];
  dVar38 = (geom->super_CoordSys).inv_dx[2];
  if (fluxes_are_area_weighted) {
    dVar37 = dVar39 * dVar37 * dVar38 * mult;
    dVar38 = dVar37;
    dVar39 = dVar37;
  }
  else {
    dVar39 = dVar39 * mult;
    dVar37 = dVar37 * mult;
    dVar38 = dVar38 * mult;
  }
  if (0 < ncomp) {
    iVar1 = (fx->begin).x;
    lVar16 = fy->kstride;
    iVar2 = (bx->smallend).vect[0];
    lVar17 = fy->nstride;
    local_120 = fy->p + ((long)iVar2 - (long)(fy->begin).x);
    iVar3 = (fy->begin).y;
    iVar4 = (fy->begin).z;
    local_118 = fz->p + ((long)iVar2 - (long)(fz->begin).x);
    lVar18 = fz->jstride;
    lVar19 = fz->nstride;
    iVar5 = (fz->begin).z;
    iVar6 = (fz->begin).y;
    local_110 = div->p + ((long)iVar2 - (long)(div->begin).x);
    pdVar20 = fx->p;
    lVar21 = fx->jstride;
    lVar22 = fx->kstride;
    lVar23 = fx->nstride;
    iVar7 = (fx->begin).z;
    iVar8 = (fx->begin).y;
    lVar24 = div->jstride;
    lVar25 = div->kstride;
    lVar26 = div->nstride;
    iVar9 = (div->begin).z;
    iVar10 = (div->begin).y;
    iVar11 = (bx->smallend).vect[2];
    iVar12 = (bx->bigend).vect[2];
    iVar13 = (bx->bigend).vect[0];
    iVar14 = (bx->bigend).vect[1];
    iVar15 = (bx->smallend).vect[1];
    lVar31 = fz->kstride * 8;
    lVar27 = fy->jstride * 8;
    local_108 = pdVar20 + ((long)iVar2 - (long)iVar1);
    local_160 = 0;
    do {
      if (iVar11 <= iVar12) {
        iVar29 = iVar11;
        do {
          if (iVar15 <= iVar14) {
            lVar32 = (long)(iVar29 - iVar7);
            lVar34 = (long)(iVar29 - iVar4) * lVar16 * 8;
            lVar35 = (long)iVar15;
            do {
              iVar28 = (int)lVar35;
              if (iVar2 <= iVar13) {
                lVar33 = lVar35 - iVar8;
                lVar30 = (lVar35 - iVar6) * lVar18 * 8;
                lVar36 = 0;
                do {
                  *(double *)
                   ((long)local_110 +
                   lVar36 * 8 + (lVar35 - iVar10) * lVar24 * 8 + (long)(iVar29 - iVar9) * lVar25 * 8
                   ) = (*(double *)
                         ((long)local_118 + lVar36 * 8 + lVar30 + ((iVar29 + 1) - iVar5) * lVar31) -
                       *(double *)
                        ((long)local_118 + lVar36 * 8 + lVar30 + (iVar29 - iVar5) * lVar31)) *
                       dVar38 + (*(double *)
                                  ((long)local_120 +
                                  lVar36 * 8 + ((iVar28 + 1) - iVar3) * lVar27 + lVar34) -
                                *(double *)
                                 ((long)local_120 + lVar36 * 8 + (lVar35 - iVar3) * lVar27 + lVar34)
                                ) * dVar37 +
                                (pdVar20[local_160 * lVar23 +
                                         lVar22 * lVar32 +
                                         lVar33 * lVar21 + (long)((int)lVar36 + (iVar2 - iVar1) + 1)
                                        ] -
                                *(double *)
                                 ((long)local_108 +
                                 lVar36 * 8 + lVar33 * lVar21 * 8 + lVar32 * lVar22 * 8)) * dVar39;
                  lVar36 = lVar36 + 1;
                } while ((iVar13 - iVar2) + 1 != (int)lVar36);
              }
              lVar35 = lVar35 + 1;
            } while (iVar28 + 1 != iVar14 + 1);
          }
          iVar29 = iVar29 + 1;
        } while (iVar29 != iVar12 + 1);
      }
      local_160 = local_160 + 1;
      local_110 = local_110 + lVar26;
      local_118 = local_118 + lVar19;
      local_120 = local_120 + lVar17;
      local_108 = local_108 + lVar23;
    } while (local_160 != (uint)ncomp);
  }
  return;
}

Assistant:

void
HydroUtils::ComputeDivergence ( Box const& bx,
                                Array4<Real> const& div,
                                AMREX_D_DECL( Array4<Real const> const& fx,
                                              Array4<Real const> const& fy,
                                              Array4<Real const> const& fz),
                                const int ncomp, Geometry const& geom,
                                const Real mult,
                                const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        const int ngrow_metric = 0;
        FArrayBox vol_fab;
        geom.GetVolume(vol_fab,BoxArray(bx),0,ngrow_metric);
        Elixir vol_eli = vol_fab.elixir();
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (!fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_metric);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& vol = vol_fab.const_array();
        const auto& ax  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                     : area[0].const_array();
        const auto& ay  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                      : area[1].const_array();
        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                div(i,j,k,n) = ( fx(i+1,j,k,n) -  fx(i,j,k,n) +
                                 fy(i,j+1,k,n) -  fy(i,j,k,n) ) * mult / vol(i,j,k);
            } else {
                div(i,j,k,n) = ( ax(i+1,j,k)*fx(i+1,j,k,n) -  ax(i,j,k)*fx(i,j,k,n) +
                                 ay(i,j+1,k)*fy(i,j+1,k,n) -  ay(i,j,k)*fy(i,j,k,n) ) * mult / vol(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dxinv = geom.InvCellSizeArray();
        AMREX_D_TERM(Real fact_x = mult;,
                     Real fact_y = mult;,
                     Real fact_z = mult;);

        if (fluxes_are_area_weighted) {
            Real qvol = AMREX_D_TERM(dxinv[0],*dxinv[1],*dxinv[2]);

            AMREX_D_TERM(fact_x *= qvol;,
                         fact_y *= qvol;,
                         fact_z *= qvol;);
        } else {
            AMREX_D_TERM(fact_x *= dxinv[0];,
                         fact_y *= dxinv[1];,
                         fact_z *= dxinv[2];);
        }

        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            div(i,j,k,n) = AMREX_D_TERM(  fact_x * ( fx(i+1,j,k,n) - fx(i,j,k,n) ),
                                        + fact_y * ( fy(i,j+1,k,n) - fy(i,j,k,n) ),
                                        + fact_z * ( fz(i,j,k+1,n) - fz(i,j,k,n) ));
        });
    }